

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O2

bool duckdb::TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
               (char *sdata,idx_t slen,char *pdata,idx_t plen,char escape)

{
  ulong uVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  idx_t iVar6;
  undefined7 in_register_00000081;
  bool bVar7;
  idx_t sidx;
  idx_t local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000081,escape);
  local_40 = 0;
  uVar5 = 0;
  do {
    if ((plen <= uVar5) || (slen <= local_40)) {
      for (; (iVar6 = plen, plen != uVar5 && (iVar6 = uVar5, pdata[uVar5] == '%'));
          uVar5 = uVar5 + 1) {
      }
      return local_40 == slen && iVar6 == plen;
    }
    cVar2 = pdata[uVar5];
    if (cVar2 == '_') {
      StandardCharacterReader::NextCharacter(sdata,slen,&local_40);
    }
    else {
      if (cVar2 == '%') {
        do {
          uVar1 = uVar5 + 1;
          bVar7 = true;
          if (plen <= uVar1) {
            return true;
          }
          lVar3 = uVar5 + 1;
          uVar5 = uVar1;
        } while (pdata[lVar3] == '%');
        if (plen - uVar1 != 0) {
          cVar2 = (char)local_34;
          while( true ) {
            iVar6 = slen - local_40;
            bVar7 = slen >= local_40 && iVar6 != 0;
            if ((slen < local_40 || iVar6 == 0) ||
               (bVar4 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
                                  (sdata + local_40,iVar6,pdata + uVar1,plen - uVar1,cVar2), bVar4))
            break;
            local_40 = local_40 + 1;
          }
        }
        return bVar7;
      }
      if (cVar2 != sdata[local_40]) {
        return false;
      }
      local_40 = local_40 + 1;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool TemplatedLikeOperator(const char *sdata, idx_t slen, const char *pdata, idx_t plen, char escape) {
	idx_t pidx = 0;
	idx_t sidx = 0;
	for (; pidx < plen && sidx < slen; pidx++) {
		char pchar = READER::Operation(pdata, pidx);
		char schar = READER::Operation(sdata, sidx);
		if (HAS_ESCAPE && pchar == escape) {
			pidx++;
			if (pidx == plen) {
				throw SyntaxException("Like pattern must not end with escape character!");
			}
			if (pdata[pidx] != schar) {
				return false;
			}
			sidx++;
		} else if (pchar == UNDERSCORE) {
			READER::NextCharacter(sdata, slen, sidx);
		} else if (pchar == PERCENTAGE) {
			pidx++;
			while (pidx < plen && pdata[pidx] == PERCENTAGE) {
				pidx++;
			}
			if (pidx == plen) {
				return true; /* tail is acceptable */
			}
			for (; sidx < slen; sidx++) {
				if (TemplatedLikeOperator<PERCENTAGE, UNDERSCORE, HAS_ESCAPE, READER>(
				        sdata + sidx, slen - sidx, pdata + pidx, plen - pidx, escape)) {
					return true;
				}
			}
			return false;
		} else if (pchar == schar) {
			sidx++;
		} else {
			return false;
		}
	}
	while (pidx < plen && pdata[pidx] == PERCENTAGE) {
		pidx++;
	}
	return pidx == plen && sidx == slen;
}